

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::LE_Fire_PDU::SetMunitionEntityID(LE_Fire_PDU *this,LE_EntityIdentifier *ID)

{
  KUINT16 *pKVar1;
  LE_EntityIdentifier *this_00;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  byte bVar5;
  short sVar6;
  
  if (((this->m_FireFlagUnion).m_ui8Flag & 4) == 0) {
    (this->m_FireFlagUnion).m_ui8Flag = (this->m_FireFlagUnion).m_ui8Flag | 4;
    pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + 2;
  }
  KVar3 = ID->m_ui8ApplicationID;
  KVar2 = ID->m_ui16EntityID;
  (this->m_MunitionID).m_ui8SiteID = ID->m_ui8SiteID;
  (this->m_MunitionID).m_ui8ApplicationID = KVar3;
  (this->m_MunitionID).m_ui16EntityID = KVar2;
  this_00 = &(this->super_LE_Header).m_EntID;
  KVar3 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(this_00);
  KVar4 = DATA_TYPE::LE_EntityIdentifier::GetSiteID(ID);
  if (KVar3 == KVar4) {
    KVar3 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(this_00);
    KVar4 = DATA_TYPE::LE_EntityIdentifier::GetApplicationID(ID);
    if (KVar3 == KVar4) {
      if (((this->m_FireFlagUnion).m_ui8Flag & 2) == 0) {
        return;
      }
      bVar5 = (this->m_FireFlagUnion).m_ui8Flag & 0xfd;
      sVar6 = -2;
      goto LAB_00270855;
    }
  }
  if (((this->m_FireFlagUnion).m_ui8Flag & 2) != 0) {
    return;
  }
  bVar5 = (this->m_FireFlagUnion).m_ui8Flag | 2;
  sVar6 = 2;
LAB_00270855:
  (this->m_FireFlagUnion).m_ui8Flag = bVar5;
  pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + sVar6;
  return;
}

Assistant:

void LE_Fire_PDU::SetMunitionEntityID( const LE_EntityIdentifier & ID )
{
    SetMunitionEntityIDFlag( true );
    m_MunitionID = ID;

    // Check if the firing entity's site and application values
    // are the same, if they are we don't include them.
    if( m_EntID.GetSiteID() == ID.GetSiteID() &&
            m_EntID.GetApplicationID() == ID.GetApplicationID() )
    {
        // They match so don't include the fields
        SetMunitionEntityIDSiteAppIncludedFlag( false );
    }
    else
    {
        // They don't match so we need to send these fields.
        SetMunitionEntityIDSiteAppIncludedFlag( true );
    }
}